

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

Slice __thiscall leveldb::anon_unknown_3::DBIter::key(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  Slice SVar2;
  Slice local_10;
  
  if (this->valid_ != false) {
    if (this->direction_ == kForward) {
      iVar1 = (*this->iter_->_vptr_Iterator[8])();
      local_10.data_ = (char *)CONCAT44(extraout_var,iVar1);
      SVar2 = ExtractUserKey(&local_10);
    }
    else {
      SVar2.data_ = (this->saved_key_)._M_dataplus._M_p;
      SVar2.size_ = (this->saved_key_)._M_string_length;
    }
    return SVar2;
  }
  __assert_fail("valid_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_iter.cc"
                ,0x46,"virtual Slice leveldb::(anonymous namespace)::DBIter::key() const");
}

Assistant:

virtual Slice key() const {
                assert(valid_);
                return (direction_ == kForward) ? ExtractUserKey(iter_->key()) : saved_key_;
            }